

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  Geometry *this;
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  bool bVar20;
  long lVar21;
  byte bVar22;
  AABBNodeMB4D *node1;
  ulong uVar23;
  byte bVar24;
  ulong uVar25;
  ulong *puVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2448 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 == 8) {
    bVar19 = false;
  }
  else {
    local_2370[0] = 0;
    auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
    auVar52 = ZEXT3264(auVar31);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2448 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar3 = (context->query_radius).field_0;
      local_2448 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    }
    puVar26 = local_2368;
    auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.x));
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.y));
    auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.z));
    auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
    auVar54 = ZEXT3264(auVar35);
    auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
    auVar56 = ZEXT3264(auVar35);
    auVar30 = vmulss_avx512f(auVar31._0_16_,auVar31._0_16_);
    auVar31._0_4_ = auVar30._0_4_;
    auVar31._4_4_ = auVar31._0_4_;
    auVar31._8_4_ = auVar31._0_4_;
    auVar31._12_4_ = auVar31._0_4_;
    auVar31._16_4_ = auVar31._0_4_;
    auVar31._20_4_ = auVar31._0_4_;
    auVar31._24_4_ = auVar31._0_4_;
    auVar31._28_4_ = auVar31._0_4_;
    bVar19 = false;
    auVar35 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar57 = ZEXT3264(auVar35);
    auVar35 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar58 = ZEXT3264(auVar35);
    do {
      auVar51 = auVar52._0_32_;
      auVar35 = vsubps_avx512vl(auVar32,auVar51);
      auVar36 = vaddps_avx512vl(auVar32,auVar51);
      auVar53 = auVar54._0_32_;
      auVar37 = vsubps_avx512vl(auVar33,auVar53);
      auVar38 = vaddps_avx512vl(auVar33,auVar53);
      auVar55 = auVar56._0_32_;
      auVar39 = vsubps_avx512vl(auVar34,auVar55);
      auVar40 = vaddps_avx512vl(auVar34,auVar55);
LAB_01f31921:
      pfVar1 = (float *)(puVar26 + -1);
      puVar26 = puVar26 + -2;
      if (*pfVar1 <= (float)local_2448._0_4_) {
        uVar28 = *puVar26;
        do {
          do {
            uVar27 = (uint)uVar28;
            if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
              if ((uVar28 & 8) != 0) {
LAB_01f31e7d:
                if ((ulong)(uVar27 & 0xf) != 8) {
                  lVar21 = 0;
                  bVar24 = 0;
                  do {
                    bVar22 = bVar24;
                    uVar4 = *(uint *)((uVar28 & 0xfffffffffffffff0) + lVar21 * 8);
                    this = (context->scene->geometries).items[uVar4].ptr;
                    context->geomID = uVar4;
                    context->primID = *(uint *)((uVar28 & 0xfffffffffffffff0) + 4 + lVar21 * 8);
                    bVar20 = Geometry::pointQuery(this,query,context);
                    lVar21 = lVar21 + 1;
                    bVar24 = bVar22 | bVar20;
                  } while ((ulong)(uVar27 & 0xf) - 8 != lVar21);
                  if (bVar22 == 0 && !bVar20) {
                    auVar52 = ZEXT3264(auVar51);
                    auVar54 = ZEXT3264(auVar53);
                    auVar56 = ZEXT3264(auVar55);
                    auVar31 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar57 = ZEXT3264(auVar31);
                    auVar31 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar58 = ZEXT3264(auVar31);
                  }
                  else {
                    auVar31 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[0]));
                    auVar52 = ZEXT3264(auVar31);
                    auVar31 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[1]));
                    auVar54 = ZEXT3264(auVar31);
                    auVar31 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[2]));
                    auVar56 = ZEXT3264(auVar31);
                    auVar31 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar57 = ZEXT3264(auVar31);
                    auVar31 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar58 = ZEXT3264(auVar31);
                    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                      local_2448 = ZEXT416((uint)(query->radius * query->radius));
                    }
                    else {
                      aVar3 = (context->query_radius).field_0;
                      local_2448 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
                    }
                    bVar19 = true;
                  }
                }
                goto LAB_01f31fbb;
              }
              uVar23 = uVar28 & 0xfffffffffffffff0;
              fVar2 = query->time;
              auVar47._4_4_ = fVar2;
              auVar47._0_4_ = fVar2;
              auVar47._8_4_ = fVar2;
              auVar47._12_4_ = fVar2;
              auVar47._16_4_ = fVar2;
              auVar47._20_4_ = fVar2;
              auVar47._24_4_ = fVar2;
              auVar47._28_4_ = fVar2;
              auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100),auVar47,
                                        *(undefined1 (*) [32])(uVar23 + 0x40));
              auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x140),auVar47,
                                        *(undefined1 (*) [32])(uVar23 + 0x80));
              auVar15 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x180),auVar47,
                                        *(undefined1 (*) [32])(uVar23 + 0xc0));
              auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x120),auVar47,
                                        *(undefined1 (*) [32])(uVar23 + 0x60));
              auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x160),auVar47,
                                        *(undefined1 (*) [32])(uVar23 + 0xa0));
              auVar18 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x1a0),auVar47,
                                        *(undefined1 (*) [32])(uVar23 + 0xe0));
              auVar41 = vmaxps_avx512vl(auVar32,ZEXT1632(auVar30));
              auVar41 = vminps_avx(auVar41,ZEXT1632(auVar16));
              auVar42 = vsubps_avx512vl(auVar41,auVar32);
              auVar41 = vmaxps_avx512vl(auVar33,ZEXT1632(auVar14));
              auVar41 = vminps_avx(auVar41,ZEXT1632(auVar17));
              auVar43 = vsubps_avx512vl(auVar41,auVar33);
              auVar41 = vmaxps_avx512vl(auVar34,ZEXT1632(auVar15));
              auVar41 = vminps_avx(auVar41,ZEXT1632(auVar18));
              auVar41 = vsubps_avx512vl(auVar41,auVar34);
              auVar49._0_4_ =
                   auVar41._0_4_ * auVar41._0_4_ +
                   auVar42._0_4_ * auVar42._0_4_ + auVar43._0_4_ * auVar43._0_4_;
              auVar49._4_4_ =
                   auVar41._4_4_ * auVar41._4_4_ +
                   auVar42._4_4_ * auVar42._4_4_ + auVar43._4_4_ * auVar43._4_4_;
              auVar49._8_4_ =
                   auVar41._8_4_ * auVar41._8_4_ +
                   auVar42._8_4_ * auVar42._8_4_ + auVar43._8_4_ * auVar43._8_4_;
              auVar49._12_4_ =
                   auVar41._12_4_ * auVar41._12_4_ +
                   auVar42._12_4_ * auVar42._12_4_ + auVar43._12_4_ * auVar43._12_4_;
              auVar49._16_4_ =
                   auVar41._16_4_ * auVar41._16_4_ +
                   auVar42._16_4_ * auVar42._16_4_ + auVar43._16_4_ * auVar43._16_4_;
              auVar49._20_4_ =
                   auVar41._20_4_ * auVar41._20_4_ +
                   auVar42._20_4_ * auVar42._20_4_ + auVar43._20_4_ * auVar43._20_4_;
              auVar49._24_4_ =
                   auVar41._24_4_ * auVar41._24_4_ +
                   auVar42._24_4_ * auVar42._24_4_ + auVar43._24_4_ * auVar43._24_4_;
              auVar49._28_4_ = auVar41._28_4_ + auVar43._28_4_ + 0.0;
              uVar29 = vcmpps_avx512vl(auVar49,auVar31,2);
              uVar25 = vcmpps_avx512vl(ZEXT1632(auVar30),ZEXT1632(auVar16),2);
              uVar29 = uVar29 & uVar25;
              if ((uVar27 & 7) == 6) {
                uVar12 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [32])(uVar23 + 0x1c0),0xd);
                uVar11 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [32])(uVar23 + 0x1e0),1);
                uVar29 = (ulong)(byte)((byte)uVar12 & (byte)uVar11 & (byte)uVar29);
              }
            }
            else {
              if ((uVar28 & 8) != 0) goto LAB_01f31e7d;
              uVar25 = uVar28 & 0xfffffffffffffff0;
              fVar2 = query->time;
              auVar44._4_4_ = fVar2;
              auVar44._0_4_ = fVar2;
              auVar44._8_4_ = fVar2;
              auVar44._12_4_ = fVar2;
              auVar44._16_4_ = fVar2;
              auVar44._20_4_ = fVar2;
              auVar44._24_4_ = fVar2;
              auVar44._28_4_ = fVar2;
              auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100),auVar44,
                                        *(undefined1 (*) [32])(uVar25 + 0x40));
              auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x140),auVar44,
                                        *(undefined1 (*) [32])(uVar25 + 0x80));
              auVar15 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x180),auVar44,
                                        *(undefined1 (*) [32])(uVar25 + 0xc0));
              auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x120),auVar44,
                                        *(undefined1 (*) [32])(uVar25 + 0x60));
              auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x160),auVar44,
                                        *(undefined1 (*) [32])(uVar25 + 0xa0));
              auVar18 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x1a0),auVar44,
                                        *(undefined1 (*) [32])(uVar25 + 0xe0));
              auVar41 = vmaxps_avx512vl(auVar32,ZEXT1632(auVar30));
              auVar41 = vminps_avx(auVar41,ZEXT1632(auVar16));
              auVar42 = vsubps_avx512vl(auVar41,auVar32);
              auVar41 = vmaxps_avx512vl(auVar33,ZEXT1632(auVar14));
              auVar41 = vminps_avx(auVar41,ZEXT1632(auVar17));
              auVar41 = vsubps_avx512vl(auVar41,auVar33);
              auVar43 = vmaxps_avx512vl(auVar34,ZEXT1632(auVar15));
              auVar43 = vminps_avx512vl(auVar43,ZEXT1632(auVar18));
              auVar43 = vsubps_avx512vl(auVar43,auVar34);
              auVar43 = vmulps_avx512vl(auVar43,auVar43);
              auVar49._0_4_ =
                   auVar43._0_4_ + auVar41._0_4_ * auVar41._0_4_ + auVar42._0_4_ * auVar42._0_4_;
              auVar49._4_4_ =
                   auVar43._4_4_ + auVar41._4_4_ * auVar41._4_4_ + auVar42._4_4_ * auVar42._4_4_;
              auVar49._8_4_ =
                   auVar43._8_4_ + auVar41._8_4_ * auVar41._8_4_ + auVar42._8_4_ * auVar42._8_4_;
              auVar49._12_4_ =
                   auVar43._12_4_ +
                   auVar41._12_4_ * auVar41._12_4_ + auVar42._12_4_ * auVar42._12_4_;
              auVar49._16_4_ =
                   auVar43._16_4_ +
                   auVar41._16_4_ * auVar41._16_4_ + auVar42._16_4_ * auVar42._16_4_;
              auVar49._20_4_ =
                   auVar43._20_4_ +
                   auVar41._20_4_ * auVar41._20_4_ + auVar42._20_4_ * auVar42._20_4_;
              auVar49._24_4_ =
                   auVar43._24_4_ +
                   auVar41._24_4_ * auVar41._24_4_ + auVar42._24_4_ * auVar42._24_4_;
              auVar49._28_4_ = auVar43._28_4_ + auVar41._28_4_ + auVar42._28_4_;
              uVar12 = vcmpps_avx512vl(ZEXT1632(auVar30),ZEXT1632(auVar16),2);
              uVar11 = vcmpps_avx512vl(ZEXT1632(auVar16),auVar35,1);
              uVar6 = vcmpps_avx512vl(ZEXT1632(auVar30),auVar36,6);
              uVar7 = vcmpps_avx512vl(ZEXT1632(auVar17),auVar37,1);
              uVar8 = vcmpps_avx512vl(ZEXT1632(auVar14),auVar38,6);
              uVar9 = vcmpps_avx512vl(ZEXT1632(auVar18),auVar39,1);
              uVar10 = vcmpps_avx512vl(ZEXT1632(auVar15),auVar40,6);
              bVar24 = ~((byte)uVar8 | (byte)uVar6 | (byte)uVar10 | (byte)uVar11 |
                        (byte)uVar7 | (byte)uVar9) & (byte)uVar12;
              uVar29 = (ulong)bVar24;
              if ((uVar27 & 7) == 6) {
                uVar12 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [32])(uVar25 + 0x1e0),1);
                uVar11 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [32])(uVar25 + 0x1c0),0xd);
                uVar29 = (ulong)(bVar24 & (byte)uVar12 & (byte)uVar11);
              }
            }
            bVar24 = (byte)uVar29;
            if (bVar24 == 0) {
              if (puVar26 == &local_2378) {
                return bVar19;
              }
              goto LAB_01f31921;
            }
            auVar41 = *(undefined1 (*) [32])(uVar28 & 0xfffffffffffffff0);
            auVar42 = ((undefined1 (*) [32])(uVar28 & 0xfffffffffffffff0))[1];
            auVar43 = vmovdqa64_avx512vl(auVar57._0_32_);
            auVar43 = vpternlogd_avx512vl(auVar43,auVar49,auVar58._0_32_,0xf8);
            auVar44 = vpcompressd_avx512vl(auVar43);
            auVar46._0_4_ =
                 (uint)(bVar24 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar43._0_4_;
            bVar20 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar20 * auVar44._4_4_ | (uint)!bVar20 * auVar43._4_4_;
            bVar20 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar20 * auVar44._8_4_ | (uint)!bVar20 * auVar43._8_4_;
            bVar20 = (bool)((byte)(uVar29 >> 3) & 1);
            auVar46._12_4_ = (uint)bVar20 * auVar44._12_4_ | (uint)!bVar20 * auVar43._12_4_;
            bVar20 = (bool)((byte)(uVar29 >> 4) & 1);
            auVar46._16_4_ = (uint)bVar20 * auVar44._16_4_ | (uint)!bVar20 * auVar43._16_4_;
            bVar20 = (bool)((byte)(uVar29 >> 5) & 1);
            auVar46._20_4_ = (uint)bVar20 * auVar44._20_4_ | (uint)!bVar20 * auVar43._20_4_;
            bVar20 = (bool)((byte)(uVar29 >> 6) & 1);
            auVar46._24_4_ = (uint)bVar20 * auVar44._24_4_ | (uint)!bVar20 * auVar43._24_4_;
            bVar20 = SUB81(uVar29 >> 7,0);
            auVar46._28_4_ = (uint)bVar20 * auVar44._28_4_ | (uint)!bVar20 * auVar43._28_4_;
            auVar43 = vpermt2q_avx512vl(auVar41,auVar46,auVar42);
            uVar28 = auVar43._0_8_;
            bVar24 = bVar24 - 1 & bVar24;
          } while (bVar24 == 0);
          auVar43 = vpshufd_avx2(auVar46,0x55);
          vpermt2q_avx512vl(auVar41,auVar43,auVar42);
          auVar44 = vpminsd_avx2(auVar46,auVar43);
          auVar43 = vpmaxsd_avx2(auVar46,auVar43);
          bVar24 = bVar24 - 1 & bVar24;
          if (bVar24 == 0) {
            auVar44 = vpermi2q_avx512vl(auVar44,auVar41,auVar42);
            uVar28 = auVar44._0_8_;
            auVar41 = vpermt2q_avx512vl(auVar41,auVar43,auVar42);
            *puVar26 = auVar41._0_8_;
            auVar41 = vpermd_avx2(auVar43,auVar49);
            *(int *)(puVar26 + 1) = auVar41._0_4_;
            puVar26 = puVar26 + 2;
          }
          else {
            auVar48 = vpshufd_avx2(auVar46,0xaa);
            vpermt2q_avx512vl(auVar41,auVar48,auVar42);
            auVar47 = vpminsd_avx2(auVar44,auVar48);
            auVar44 = vpmaxsd_avx2(auVar44,auVar48);
            auVar48 = vpminsd_avx2(auVar43,auVar44);
            auVar43 = vpmaxsd_avx2(auVar43,auVar44);
            bVar24 = bVar24 - 1 & bVar24;
            if (bVar24 == 0) {
              auVar44 = vpermi2q_avx512vl(auVar47,auVar41,auVar42);
              uVar28 = auVar44._0_8_;
              auVar44 = vpermt2q_avx512vl(auVar41,auVar43,auVar42);
              *puVar26 = auVar44._0_8_;
              auVar43 = vpermd_avx2(auVar43,auVar49);
              *(int *)(puVar26 + 1) = auVar43._0_4_;
              auVar41 = vpermt2q_avx512vl(auVar41,auVar48,auVar42);
              puVar26[2] = auVar41._0_8_;
              auVar41 = vpermd_avx2(auVar48,auVar49);
              *(int *)(puVar26 + 3) = auVar41._0_4_;
              puVar26 = puVar26 + 4;
            }
            else {
              auVar44 = vpshufd_avx2(auVar46,0xff);
              vpermt2q_avx512vl(auVar41,auVar44,auVar42);
              auVar5 = vpminsd_avx2(auVar47,auVar44);
              auVar44 = vpmaxsd_avx2(auVar47,auVar44);
              auVar47 = vpminsd_avx2(auVar48,auVar44);
              auVar44 = vpmaxsd_avx2(auVar48,auVar44);
              auVar48 = vpminsd_avx2(auVar43,auVar44);
              auVar43 = vpmaxsd_avx2(auVar43,auVar44);
              bVar24 = bVar24 - 1 & bVar24;
              if (bVar24 == 0) {
                auVar44 = vpermi2q_avx512vl(auVar5,auVar41,auVar42);
                uVar28 = auVar44._0_8_;
                auVar44 = vpermt2q_avx512vl(auVar41,auVar43,auVar42);
                *puVar26 = auVar44._0_8_;
                auVar43 = vpermd_avx2(auVar43,auVar49);
                *(int *)(puVar26 + 1) = auVar43._0_4_;
                auVar43 = vpermt2q_avx512vl(auVar41,auVar48,auVar42);
                puVar26[2] = auVar43._0_8_;
                auVar43 = vpermd_avx2(auVar48,auVar49);
                *(int *)(puVar26 + 3) = auVar43._0_4_;
                auVar41 = vpermt2q_avx512vl(auVar41,auVar47,auVar42);
                puVar26[4] = auVar41._0_8_;
                auVar41 = vpermd_avx2(auVar47,auVar49);
                *(int *)(puVar26 + 5) = auVar41._0_4_;
                puVar26 = puVar26 + 6;
              }
              else {
                auVar45 = valignd_avx512vl(auVar46,auVar46,3);
                auVar44 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar46 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar44,auVar5);
                auVar44 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar47 = vpermt2d_avx512vl(auVar46,auVar44,auVar47);
                auVar47 = vpermt2d_avx512vl(auVar47,auVar44,auVar48);
                auVar44 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar43 = vpermt2d_avx512vl(auVar47,auVar44,auVar43);
                auVar50 = ZEXT3264(auVar43);
                bVar22 = bVar24;
                do {
                  auVar44 = auVar50._0_32_;
                  auVar43._8_4_ = 1;
                  auVar43._0_8_ = 0x100000001;
                  auVar43._12_4_ = 1;
                  auVar43._16_4_ = 1;
                  auVar43._20_4_ = 1;
                  auVar43._24_4_ = 1;
                  auVar43._28_4_ = 1;
                  auVar43 = vpermd_avx2(auVar43,auVar45);
                  auVar45 = valignd_avx512vl(auVar45,auVar45,1);
                  vpermt2q_avx512vl(auVar41,auVar45,auVar42);
                  bVar22 = bVar22 - 1 & bVar22;
                  uVar12 = vpcmpd_avx512vl(auVar43,auVar44,5);
                  auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                  bVar13 = (byte)uVar12 << 1;
                  auVar44 = valignd_avx512vl(auVar44,auVar44,7);
                  bVar20 = (bool)((byte)uVar12 & 1);
                  auVar48._4_4_ = (uint)bVar20 * auVar44._4_4_ | (uint)!bVar20 * auVar43._4_4_;
                  auVar48._0_4_ = auVar43._0_4_;
                  bVar20 = (bool)(bVar13 >> 2 & 1);
                  auVar48._8_4_ = (uint)bVar20 * auVar44._8_4_ | (uint)!bVar20 * auVar43._8_4_;
                  bVar20 = (bool)(bVar13 >> 3 & 1);
                  auVar48._12_4_ = (uint)bVar20 * auVar44._12_4_ | (uint)!bVar20 * auVar43._12_4_;
                  bVar20 = (bool)(bVar13 >> 4 & 1);
                  auVar48._16_4_ = (uint)bVar20 * auVar44._16_4_ | (uint)!bVar20 * auVar43._16_4_;
                  bVar20 = (bool)(bVar13 >> 5 & 1);
                  auVar48._20_4_ = (uint)bVar20 * auVar44._20_4_ | (uint)!bVar20 * auVar43._20_4_;
                  bVar20 = (bool)(bVar13 >> 6 & 1);
                  auVar48._24_4_ = (uint)bVar20 * auVar44._24_4_ | (uint)!bVar20 * auVar43._24_4_;
                  auVar48._28_4_ =
                       (uint)(bVar13 >> 7) * auVar44._28_4_ |
                       (uint)!(bool)(bVar13 >> 7) * auVar43._28_4_;
                  auVar50 = ZEXT3264(auVar48);
                } while (bVar22 != 0);
                lVar21 = (ulong)(uint)POPCOUNT((uint)bVar24) + 3;
                do {
                  auVar43 = vpermi2q_avx512vl(auVar48,auVar41,auVar42);
                  *puVar26 = auVar43._0_8_;
                  auVar44 = auVar50._0_32_;
                  auVar43 = vpermd_avx2(auVar44,auVar49);
                  *(int *)(puVar26 + 1) = auVar43._0_4_;
                  auVar48 = valignd_avx512vl(auVar44,auVar44,1);
                  puVar26 = puVar26 + 2;
                  auVar50 = ZEXT3264(auVar48);
                  lVar21 = lVar21 + -1;
                } while (lVar21 != 0);
                auVar41 = vpermt2q_avx512vl(auVar41,auVar48,auVar42);
                uVar28 = auVar41._0_8_;
              }
            }
          }
        } while( true );
      }
LAB_01f31fbb:
      auVar31 = vmulps_avx512vl(auVar52._0_32_,auVar52._0_32_);
    } while (puVar26 != &local_2378);
  }
  return bVar19;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }